

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O1

bool absl::lts_20250127::container_internal::anon_unknown_2::ShouldRehashForBugDetection
               (ctrl_t *ctrl,size_t capacity)

{
  long lVar1;
  ulong uVar2;
  long *in_FS_OFFSET;
  
  lVar1 = in_FS_OFFSET[-8];
  in_FS_OFFSET[-8] = lVar1 + 1U;
  if ((capacity + 1 & capacity) == 0) {
    uVar2 = (*in_FS_OFFSET - 0x40U ^ (ulong)&hash_internal::MixingHashState::kSeed ^ lVar1 + 1U) *
            -0x234dd359734ecb13;
    return (((uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18
              | (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18
              | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 7 ^ (ulong)ctrl >> 0xc) & capacity) <
           0x10;
  }
  __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x14c,
                "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
}

Assistant:

inline size_t RandomSeed() {
#ifdef ABSL_HAVE_THREAD_LOCAL
  static thread_local size_t counter = 0;
  // On Linux kernels >= 5.4 the MSAN runtime has a false-positive when
  // accessing thread local storage data from loaded libraries
  // (https://github.com/google/sanitizers/issues/1265), for this reason counter
  // needs to be annotated as initialized.
  ABSL_ANNOTATE_MEMORY_IS_INITIALIZED(&counter, sizeof(size_t));
  size_t value = ++counter;
#else   // ABSL_HAVE_THREAD_LOCAL
  static std::atomic<size_t> counter(0);
  size_t value = counter.fetch_add(1, std::memory_order_relaxed);
#endif  // ABSL_HAVE_THREAD_LOCAL
  return value ^ static_cast<size_t>(reinterpret_cast<uintptr_t>(&counter));
}